

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O1

void __thiscall Js::JavascriptStaticEnumerator::Reset(JavascriptStaticEnumerator *this)

{
  JavascriptEnumerator *pJVar1;
  
  pJVar1 = (this->prefixEnumerator).ptr;
  if (pJVar1 == (JavascriptEnumerator *)0x0) {
    pJVar1 = (this->arrayEnumerator).ptr;
    if (pJVar1 == (JavascriptEnumerator *)0x0) goto LAB_00dcbce6;
    Memory::Recycler::WBSetBit((char *)&this->currentEnumerator);
    (this->currentEnumerator).ptr = pJVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->currentEnumerator);
    pJVar1 = (this->arrayEnumerator).ptr;
  }
  else {
    (*(pJVar1->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x62])();
    pJVar1 = (this->prefixEnumerator).ptr;
    Memory::Recycler::WBSetBit((char *)&this->currentEnumerator);
    (this->currentEnumerator).ptr = pJVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->currentEnumerator);
    pJVar1 = (this->arrayEnumerator).ptr;
    if (pJVar1 == (JavascriptEnumerator *)0x0) goto LAB_00dcbce6;
  }
  (*(pJVar1->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])();
LAB_00dcbce6:
  DynamicObjectPropertyEnumerator::Reset(&this->propertyEnumerator);
  return;
}

Assistant:

void JavascriptStaticEnumerator::Reset()
    {
        if (this->prefixEnumerator)
        {
            this->prefixEnumerator->Reset();
            this->currentEnumerator = this->prefixEnumerator;
            if (this->arrayEnumerator)
            {
                this->arrayEnumerator->Reset();
            }
        }
        else if (this->arrayEnumerator)
        {
            this->currentEnumerator = this->arrayEnumerator;
            this->arrayEnumerator->Reset();
        }
        this->propertyEnumerator.Reset();
    }